

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ArrayPtr<const_kj::CidrRange> kj::_::privateCidrs(void)

{
  int iVar1;
  ArrayPtr<const_kj::CidrRange> AVar2;
  StringPtr pattern;
  StringPtr pattern_00;
  StringPtr pattern_01;
  StringPtr pattern_02;
  StringPtr pattern_03;
  StringPtr pattern_04;
  StringPtr pattern_05;
  
  if (privateCidrs()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&privateCidrs()::result);
    if (iVar1 != 0) {
      pattern.content.size_ = 0xb;
      pattern.content.ptr = "10.0.0.0/8";
      CidrRange::CidrRange((CidrRange *)privateCidrs()::result,pattern);
      pattern_00.content.size_ = 0xe;
      pattern_00.content.ptr = "100.64.0.0/10";
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x18),pattern_00);
      pattern_01.content.size_ = 0xf;
      pattern_01.content.ptr = "169.254.0.0/16";
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x30),pattern_01);
      pattern_02.content.size_ = 0xe;
      pattern_02.content.ptr = "172.16.0.0/12";
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x48),pattern_02);
      pattern_03.content.size_ = 0xf;
      pattern_03.content.ptr = "192.168.0.0/16";
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x60),pattern_03);
      pattern_04.content.size_ = 9;
      pattern_04.content.ptr = "fc00::/7";
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x78),pattern_04);
      pattern_05.content.size_ = 10;
      pattern_05.content.ptr = "fe80::/10";
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x90),pattern_05);
      __cxa_guard_release(&privateCidrs()::result);
    }
  }
  AVar2.size_ = 7;
  AVar2.ptr = (CidrRange *)privateCidrs()::result;
  return AVar2;
}

Assistant:

ArrayPtr<const CidrRange> privateCidrs() {
  static const CidrRange result[] = {
    "10.0.0.0/8"_kj,            // RFC1918 reserved for internal network
    "100.64.0.0/10"_kj,         // RFC6598 "shared address space" for carrier-grade NAT
    "169.254.0.0/16"_kj,        // RFC3927 "link local" (auto-configured LAN in absence of DHCP)
    "172.16.0.0/12"_kj,         // RFC1918 reserved for internal network
    "192.168.0.0/16"_kj,        // RFC1918 reserved for internal network

    "fc00::/7"_kj,              // RFC4193 unique private network
    "fe80::/10"_kj,             // RFC4291 "link local" (auto-configured LAN in absence of DHCP)
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}